

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  pointer *pppcVar3;
  pointer __s1;
  size_t size;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  iterator __position;
  int iVar6;
  char *str;
  LogMessage *other;
  char *pcVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  char *pcVar11;
  ulong uVar12;
  size_type __n;
  ulong uVar13;
  _Hash_node_base _Var14;
  pointer __ptr_1;
  _Hash_node_base *p_Var15;
  size_type len;
  bool bVar16;
  StringPiece SVar17;
  undefined1 auVar18 [16];
  __buckets_alloc_type __alloc;
  _Hash_node_base local_90;
  Symbol local_88;
  size_t local_80;
  SymbolsByNameSet *local_78;
  string *local_70;
  LogMessage local_68;
  
  __s1 = (full_name->_M_dataplus)._M_p;
  size = full_name->_M_string_length;
  local_90._M_nxt = (_Hash_node_base *)symbol.ptr_;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  SVar17 = Symbol::full_name((Symbol *)&local_90);
  if (size == SVar17.length_) {
    bVar16 = true;
    if (size != 0 && __s1 != SVar17.ptr_) {
      iVar6 = bcmp(__s1,SVar17.ptr_,size);
      bVar16 = iVar6 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  if (!bVar16) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x679);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (full_name) == (symbol.full_name()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_88.ptr_ = (SymbolBase *)local_90._M_nxt;
  SVar17 = Symbol::full_name(&local_88);
  pcVar7 = SVar17.ptr_;
  if ((long)SVar17.length_ < 1) {
    p_Var15 = (_Hash_node_base *)0x0;
  }
  else {
    pcVar11 = pcVar7 + SVar17.length_;
    p_Var15 = (_Hash_node_base *)0x0;
    do {
      p_Var15 = (_Hash_node_base *)((long)*pcVar7 + (long)p_Var15 * 5);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar11);
  }
  uVar12 = (ulong)p_Var15 % (this->symbols_by_name_)._M_h._M_bucket_count;
  p_Var8 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->symbols_by_name_)._M_h,uVar12,(key_type *)&local_90,
                      (__hash_code)p_Var15);
  if (p_Var8 == (__node_base_ptr)0x0) {
    bVar16 = true;
  }
  else {
    bVar16 = p_Var8->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar16 != false) {
    local_78 = &this->symbols_by_name_;
    local_70 = full_name;
    p_Var9 = (_Hash_node_base *)operator_new(0x18);
    p_Var9->_M_nxt = (_Hash_node_base *)0x0;
    p_Var9[1]._M_nxt = local_90._M_nxt;
    local_80 = (this->symbols_by_name_)._M_h._M_rehash_policy._M_next_resize;
    auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_name_)._M_h._M_rehash_policy,
                         (this->symbols_by_name_)._M_h._M_bucket_count,
                         (this->symbols_by_name_)._M_h._M_element_count);
    __n = auVar18._8_8_;
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->symbols_by_name_)._M_h._M_single_bucket;
        (this->symbols_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_88,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var14._M_nxt = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_name_)._M_h._M_before_begin;
        uVar12 = 0;
        do {
          p_Var4 = (_Var14._M_nxt)->_M_nxt;
          uVar13 = (ulong)_Var14._M_nxt[2]._M_nxt % __n;
          if (__s[uVar13] == (_Hash_node_base *)0x0) {
            (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var14._M_nxt;
            __s[uVar13] = p_Var1;
            if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar12;
              goto LAB_0034ad8e;
            }
          }
          else {
            (_Var14._M_nxt)->_M_nxt = __s[uVar13]->_M_nxt;
            pp_Var10 = &__s[uVar13]->_M_nxt;
            uVar13 = uVar12;
LAB_0034ad8e:
            *pp_Var10 = _Var14._M_nxt;
          }
          _Var14._M_nxt = p_Var4;
          uVar12 = uVar13;
        } while (p_Var4 != (_Hash_node_base *)0x0);
      }
      pp_Var5 = (this->symbols_by_name_)._M_h._M_buckets;
      if (&(this->symbols_by_name_)._M_h._M_single_bucket != pp_Var5) {
        operator_delete(pp_Var5);
      }
      (this->symbols_by_name_)._M_h._M_bucket_count = __n;
      (this->symbols_by_name_)._M_h._M_buckets = __s;
      uVar12 = (ulong)p_Var15 % __n;
    }
    p_Var9[2]._M_nxt = p_Var15;
    pp_Var5 = (local_78->_M_h)._M_buckets;
    if (pp_Var5[uVar12] == (__node_base_ptr)0x0) {
      p_Var15 = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      p_Var9->_M_nxt = p_Var15;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = p_Var9;
      if (p_Var15 != (_Hash_node_base *)0x0) {
        pp_Var5[(ulong)p_Var15[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count] = p_Var9;
      }
      (local_78->_M_h)._M_buckets[uVar12] = &(this->symbols_by_name_)._M_h._M_before_begin;
    }
    else {
      p_Var9->_M_nxt = pp_Var5[uVar12]->_M_nxt;
      pp_Var5[uVar12]->_M_nxt = p_Var9;
    }
    psVar2 = &(this->symbols_by_name_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    if (bVar16 != false) {
      local_88.ptr_ = (SymbolBase *)(local_70->_M_dataplus)._M_p;
      __position._M_current =
           (this->symbols_after_checkpoint_).
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->symbols_after_checkpoint_).
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)
                   &this->symbols_after_checkpoint_,__position,(char **)&local_88);
      }
      else {
        *__position._M_current = (char *)local_88.ptr_;
        pppcVar3 = &(this->symbols_after_checkpoint_).
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar3 = *pppcVar3 + 1;
      }
    }
  }
  return bVar16;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(const std::string& full_name,
                                       Symbol symbol) {
  GOOGLE_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}